

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  IResultCapture *pIVar1;
  
  MessageInfo::MessageInfo(&this->m_info,&builder->m_info);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->m_info).message);
  std::__cxx11::string::_M_dispose();
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[6])(pIVar1,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info )
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }